

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<ProString,_QString>::~QStringBuilder(QStringBuilder<ProString,_QString> *this)

{
  QString::~QString((QString *)0x134e20);
  ProString::~ProString((ProString *)0x134e2a);
  return;
}

Assistant:

~QStringBuilder() = default;